

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O2

void __thiscall
asmjit::v1_14::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  void *p;
  long lVar1;
  int line;
  char *msg;
  ulong uVar2;
  
  uVar2 = (ulong)side;
  p = *(void **)(this + uVar2 * 8 + 8);
  if (*(long *)((long)p + 0x10) != *(long *)((long)p + 0x18)) {
    msg = "block->empty()";
    line = 0x4b;
LAB_0012757b:
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zonestack.cpp"
               ,line,msg);
  }
  lVar1 = *(long *)((long)p + (ulong)(side == 0) * 8);
  if (lVar1 == 0) {
    if (*(void **)(this + (ulong)(side == 0) * 8 + 8) == p) {
      *(size_t *)((long)p + 0x10) = middleIndex + (long)p;
      *(size_t *)((long)p + 0x18) = middleIndex + (long)p;
    }
  }
  else {
    if (*(void **)(lVar1 + uVar2 * 8) != p) {
      msg = "prev->_link[side] == block";
      line = 0x4f;
      goto LAB_0012757b;
    }
    ZoneAllocator::release(*(ZoneAllocator **)this,p,0x200);
    *(undefined8 *)(lVar1 + uVar2 * 8) = 0;
    *(long *)(this + uVar2 * 8 + 8) = lVar1;
  }
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}